

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire.hpp
# Opt level: O0

string * __thiscall
wire::string::replace
          (string *__return_storage_ptr__,string *this,string *target,string *replacement)

{
  ulong uVar1;
  string *psVar2;
  string local_50 [8];
  string s;
  size_t found;
  string *replacement_local;
  string *target_local;
  string *this_local;
  
  std::__cxx11::string::string(local_50,(string *)this);
  while( true ) {
    uVar1 = std::__cxx11::string::find(local_50,(ulong)target);
    if (uVar1 == 0xffffffffffffffff) break;
    psVar2 = (string *)std::__cxx11::string::length();
    std::__cxx11::string::replace((ulong)local_50,uVar1,psVar2);
    std::__cxx11::string::length();
  }
  string(__return_storage_ptr__,(string *)local_50);
  std::__cxx11::string::~string(local_50);
  return __return_storage_ptr__;
}

Assistant:

string replace( const std::string &target, const std::string &replacement ) const
        {
            size_t found = 0;
            std::string s = *this;

            while( ( found = s.find( target, found ) ) != string::npos )
            {
                s.replace( found, target.length(), replacement );
                found += replacement.length();
            }

            return s;
        }